

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall cmFileCopier::CheckKeyword(cmFileCopier *this,string *arg)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)arg);
  if (iVar1 == 0) {
    if (this->CurrentMatchRule == (MatchRule *)0x0) {
      this->Doing = 2;
      return true;
    }
LAB_0027d711:
    NotAfterMatch(this,arg);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)arg);
    if (iVar1 == 0) {
      this->Doing = 4;
      return true;
    }
    iVar1 = std::__cxx11::string::compare((char *)arg);
    if (iVar1 == 0) {
      this->Doing = 5;
      return true;
    }
    iVar1 = std::__cxx11::string::compare((char *)arg);
    if (iVar1 == 0) {
      if (this->CurrentMatchRule != (MatchRule *)0x0) {
        (this->CurrentMatchRule->Properties).Exclude = true;
        this->Doing = 0;
        return true;
      }
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)arg);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)arg);
        if (iVar1 == 0) {
          if (this->CurrentMatchRule == (MatchRule *)0x0) {
            this->Doing = 6;
            this->UseGivenPermissionsFile = true;
            return true;
          }
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)arg);
          if (iVar1 == 0) {
            if (this->CurrentMatchRule == (MatchRule *)0x0) {
              this->Doing = 7;
              this->UseGivenPermissionsDir = true;
              return true;
            }
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)arg);
            if (iVar1 == 0) {
              if (this->CurrentMatchRule == (MatchRule *)0x0) {
                this->Doing = 0;
                this->UseSourcePermissions = true;
                return true;
              }
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)arg);
              if (iVar1 == 0) {
                if (this->CurrentMatchRule == (MatchRule *)0x0) {
                  this->Doing = 0;
                  this->UseSourcePermissions = false;
                  return true;
                }
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)arg);
                if (iVar1 != 0) {
                  return false;
                }
                if (this->CurrentMatchRule == (MatchRule *)0x0) {
                  this->Doing = 0;
                  this->MatchlessFiles = false;
                  return true;
                }
              }
            }
          }
        }
        goto LAB_0027d711;
      }
      if (this->CurrentMatchRule != (MatchRule *)0x0) {
        this->Doing = 8;
        return true;
      }
    }
    NotBeforeMatch(this,arg);
  }
  return true;
}

Assistant:

bool cmFileCopier::CheckKeyword(std::string const& arg)
{
  if(arg == "DESTINATION")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      this->Doing = DoingDestination;
      }
    }
  else if(arg == "PATTERN")
    {
    this->Doing = DoingPattern;
    }
  else if(arg == "REGEX")
    {
    this->Doing = DoingRegex;
    }
  else if(arg == "EXCLUDE")
    {
    // Add this property to the current match rule.
    if(this->CurrentMatchRule)
      {
      this->CurrentMatchRule->Properties.Exclude = true;
      this->Doing = DoingNone;
      }
    else
      {
      this->NotBeforeMatch(arg);
      }
    }
  else if(arg == "PERMISSIONS")
    {
    if(this->CurrentMatchRule)
      {
      this->Doing = DoingPermissionsMatch;
      }
    else
      {
      this->NotBeforeMatch(arg);
      }
    }
  else if(arg == "FILE_PERMISSIONS")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      this->Doing = DoingPermissionsFile;
      this->UseGivenPermissionsFile = true;
      }
    }
  else if(arg == "DIRECTORY_PERMISSIONS")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      this->Doing = DoingPermissionsDir;
      this->UseGivenPermissionsDir = true;
      }
    }
  else if(arg == "USE_SOURCE_PERMISSIONS")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      this->Doing = DoingNone;
      this->UseSourcePermissions = true;
      }
    }
  else if(arg == "NO_SOURCE_PERMISSIONS")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      this->Doing = DoingNone;
      this->UseSourcePermissions = false;
      }
    }
  else if(arg == "FILES_MATCHING")
    {
    if(this->CurrentMatchRule)
      {
      this->NotAfterMatch(arg);
      }
    else
      {
      this->Doing = DoingNone;
      this->MatchlessFiles = false;
      }
    }
  else
    {
    return false;
    }
  return true;
}